

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_Byte * tt_cmap2_get_subheader(FT_Byte *table,FT_UInt32 char_code)

{
  bool bVar1;
  FT_Byte *local_40;
  FT_Byte *sub;
  FT_Byte *subs;
  FT_Byte *p;
  FT_UInt char_hi;
  FT_UInt char_lo;
  FT_Byte *result;
  FT_UInt32 char_code_local;
  FT_Byte *table_local;
  
  _char_hi = (FT_Byte *)0x0;
  if (char_code < 0x10000) {
    local_40 = table + 0x206;
    if (char_code >> 8 == 0) {
      if (CONCAT11(table[(ulong)((char_code & 0xff) << 1) + 6],
                   (table + (ulong)((char_code & 0xff) << 1) + 6)[1]) != 0) {
        return (FT_Byte *)0x0;
      }
    }
    else {
      bVar1 = local_40 +
              (int)(CONCAT11(table[(ulong)((char_code >> 8) << 1) + 6],
                             (table + (ulong)((char_code >> 8) << 1) + 6)[1]) & 0xfff8) == local_40;
      local_40 = local_40 +
                 (int)(CONCAT11(table[(ulong)((char_code >> 8) << 1) + 6],
                                (table + (ulong)((char_code >> 8) << 1) + 6)[1]) & 0xfff8);
      if (bVar1) {
        return (FT_Byte *)0x0;
      }
    }
    _char_hi = local_40;
  }
  return _char_hi;
}

Assistant:

static FT_Byte*
  tt_cmap2_get_subheader( FT_Byte*   table,
                          FT_UInt32  char_code )
  {
    FT_Byte*  result = NULL;


    if ( char_code < 0x10000UL )
    {
      FT_UInt   char_lo = (FT_UInt)( char_code & 0xFF );
      FT_UInt   char_hi = (FT_UInt)( char_code >> 8 );
      FT_Byte*  p       = table + 6;    /* keys table       */
      FT_Byte*  subs    = table + 518;  /* subheaders table */
      FT_Byte*  sub;


      if ( char_hi == 0 )
      {
        /* an 8-bit character code -- we use subHeader 0 in this case */
        /* to test whether the character code is in the charmap       */
        /*                                                            */
        sub = subs;  /* jump to first sub-header */

        /* check that the sub-header for this byte is 0, which */
        /* indicates that it is really a valid one-byte value; */
        /* otherwise, return 0                                 */
        /*                                                     */
        p += char_lo * 2;
        if ( TT_PEEK_USHORT( p ) != 0 )
          goto Exit;
      }
      else
      {
        /* a 16-bit character code */

        /* jump to key entry  */
        p  += char_hi * 2;
        /* jump to sub-header */
        sub = subs + ( FT_PAD_FLOOR( TT_PEEK_USHORT( p ), 8 ) );

        /* check that the high byte isn't a valid one-byte value */
        if ( sub == subs )
          goto Exit;
      }

      result = sub;
    }

  Exit:
    return result;
  }